

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BoardView.cpp
# Opt level: O0

void __thiscall BoardView::ContextMenu(BoardView *this)

{
  float fVar1;
  float fVar2;
  float fVar3;
  ulong uVar4;
  float fVar5;
  float fVar6;
  bool bVar7;
  byte bVar8;
  bool bVar9;
  int iVar10;
  element_type *peVar11;
  element_type *peVar12;
  size_type sVar13;
  reference pvVar14;
  undefined8 uVar15;
  undefined8 uVar16;
  long lVar17;
  undefined8 uVar18;
  undefined4 uVar19;
  long in_RDI;
  float fVar20;
  float fVar21;
  double dVar22;
  char *fmt;
  Annotations *pAVar23;
  Annotation ann_1;
  size_t j;
  size_t i;
  array<ImVec2,_4UL> poly;
  int hit;
  shared_ptr<Component> *part;
  iterator __end3_1;
  iterator __begin3_1;
  SharedVector<Component> *__range3_1;
  float dist;
  float dy;
  float dx;
  shared_ptr<Pin> *pin_1;
  iterator __end2;
  iterator __begin2;
  SharedVector<Pin> *__range2;
  Pin *selection;
  float min_dist;
  Annotation *ann;
  iterator __end3;
  iterator __begin3;
  vector<Annotation,_std::allocator<Annotation>_> *__range3;
  ImVec2 pos;
  double ty;
  double tx;
  bool dummy;
  char *in_stack_000023d0;
  int in_stack_000023dc;
  Annotations *in_stack_000023e0;
  char *in_stack_000023e8;
  char *in_stack_000023f0;
  char *in_stack_000023f8;
  char *in_stack_00002400;
  double in_stack_00002408;
  double in_stack_00002410;
  int in_stack_0000241c;
  Annotations *in_stack_00002420;
  char *in_stack_fffffffffffffbb8;
  undefined4 uVar24;
  Annotation *in_stack_fffffffffffffbc0;
  undefined4 in_stack_fffffffffffffbc8;
  undefined2 in_stack_fffffffffffffbcc;
  undefined1 in_stack_fffffffffffffbce;
  undefined1 in_stack_fffffffffffffbcf;
  shared_ptr<BoardElement> *in_stack_fffffffffffffbd0;
  BoardView *in_stack_fffffffffffffbd8;
  float in_stack_fffffffffffffbe0;
  ImGuiStyleVar in_stack_fffffffffffffbe4;
  Annotation *in_stack_fffffffffffffbe8;
  undefined7 in_stack_fffffffffffffbf0;
  undefined1 in_stack_fffffffffffffbf7;
  undefined1 uVar25;
  char *in_stack_fffffffffffffbf8;
  undefined4 in_stack_fffffffffffffc00;
  undefined4 in_stack_fffffffffffffc04;
  bool local_3b7;
  char local_3b5;
  byte local_3a7;
  char local_3a5;
  byte bVar26;
  char local_378;
  byte local_377;
  char local_375;
  byte local_367;
  char local_365;
  byte local_33c;
  char local_33a;
  bool local_312;
  char local_2f5;
  char local_2c9;
  undefined7 in_stack_fffffffffffffd60;
  byte in_stack_fffffffffffffd67;
  allocator<char> local_269;
  string local_268 [36];
  ImVec2 local_244;
  ImVec2 local_23c;
  byte local_233;
  byte local_232;
  allocator<char> local_231;
  string local_230 [36];
  ImVec2 local_20c;
  ImVec2 local_204;
  ImVec2 local_1fc;
  ImVec2 local_1f4;
  byte local_1eb;
  byte local_1ea;
  allocator<char> local_1e9;
  string local_1e8 [32];
  ImVec2 local_1c8;
  ImVec2 local_1c0 [21];
  ulong local_118;
  ulong local_110;
  array<ImVec2,_4UL> local_108;
  uint local_d4;
  reference local_d0;
  shared_ptr<Component> *local_c8;
  __normal_iterator<std::shared_ptr<Component>_*,_std::vector<std::shared_ptr<Component>,_std::allocator<std::shared_ptr<Component>_>_>_>
  local_c0;
  undefined8 local_b8;
  float local_b0;
  float local_ac;
  float local_a8;
  __shared_ptr<Pin,_(__gnu_cxx::_Lock_policy)2> *local_88;
  shared_ptr<Pin> *local_80;
  __normal_iterator<std::shared_ptr<Pin>_*,_std::vector<std::shared_ptr<Pin>,_std::allocator<std::shared_ptr<Pin>_>_>_>
  local_78;
  undefined8 local_70;
  element_type *local_68;
  float local_5c;
  reference local_58;
  Annotation *local_50;
  __normal_iterator<Annotation_*,_std::vector<Annotation,_std::allocator<Annotation>_>_> local_48;
  long local_40;
  ImVec2 local_38;
  ImVec2 local_30;
  float local_28;
  float id;
  Annotations *this_00;
  
  if ((ContextMenu()::pin_abi_cxx11_ == '\0') &&
     (iVar10 = __cxa_guard_acquire(&ContextMenu()::pin_abi_cxx11_), iVar10 != 0)) {
    std::__cxx11::string::string((string *)&ContextMenu()::pin_abi_cxx11_);
    __cxa_atexit(std::__cxx11::string::~string,&ContextMenu()::pin_abi_cxx11_,&__dso_handle);
    __cxa_guard_release(&ContextMenu()::pin_abi_cxx11_);
  }
  if ((ContextMenu()::partn_abi_cxx11_ == '\0') &&
     (iVar10 = __cxa_guard_acquire(&ContextMenu()::partn_abi_cxx11_), iVar10 != 0)) {
    std::__cxx11::string::string((string *)&ContextMenu()::partn_abi_cxx11_);
    __cxa_atexit(std::__cxx11::string::~string,&ContextMenu()::partn_abi_cxx11_,&__dso_handle);
    __cxa_guard_release(&ContextMenu()::partn_abi_cxx11_);
  }
  if ((ContextMenu()::net_abi_cxx11_ == '\0') &&
     (iVar10 = __cxa_guard_acquire(&ContextMenu()::net_abi_cxx11_), iVar10 != 0)) {
    std::__cxx11::string::string((string *)&ContextMenu()::net_abi_cxx11_);
    __cxa_atexit(std::__cxx11::string::~string,&ContextMenu()::net_abi_cxx11_,&__dso_handle);
    __cxa_guard_release(&ContextMenu()::net_abi_cxx11_);
  }
  _local_28 = ScreenToCoord(in_stack_fffffffffffffbd8,
                            (float)((ulong)in_stack_fffffffffffffbd0 >> 0x20),
                            SUB84(in_stack_fffffffffffffbd0,0),
                            (float)CONCAT13(in_stack_fffffffffffffbcf,
                                            CONCAT12(in_stack_fffffffffffffbce,
                                                     in_stack_fffffffffffffbcc)));
  dVar22 = std::trunc((double)((ulong)_local_28 & 0xffffffff));
  fmt = (char *)(double)SUB84(dVar22,0);
  dVar22 = std::trunc((double)((ulong)_local_28 >> 0x20));
  pAVar23 = (Annotations *)(double)SUB84(dVar22,0);
  fVar20 = DPIF(50.0);
  fVar21 = DPIF(50.0);
  ImVec2::ImVec2(&local_30,fVar20,fVar21);
  ImVec2::ImVec2(&local_38,0.0,0.0);
  ImGui::SetNextWindowPos(&local_30,0,&local_38);
  ImGui::PushStyleVar(in_stack_fffffffffffffbe4,in_stack_fffffffffffffbe0);
  bVar7 = ImGui::BeginPopupModal
                    (in_stack_fffffffffffffbf8,
                     (bool *)CONCAT17(in_stack_fffffffffffffbf7,in_stack_fffffffffffffbf0),
                     (ImGuiWindowFlags)((ulong)in_stack_fffffffffffffbe8 >> 0x20));
  if (bVar7) {
    if ((*(byte *)(in_RDI + 0xd6a8) & 1) != 0) {
      ContextMenu::contextbuf[0] = '\0';
      *(undefined1 *)(in_RDI + 0xd6a8) = 0;
      local_40 = in_RDI + 0xd1f8;
      local_48._M_current =
           (Annotation *)
           std::vector<Annotation,_std::allocator<Annotation>_>::begin
                     ((vector<Annotation,_std::allocator<Annotation>_> *)in_stack_fffffffffffffbb8);
      local_50 = (Annotation *)
                 std::vector<Annotation,_std::allocator<Annotation>_>::end
                           ((vector<Annotation,_std::allocator<Annotation>_> *)
                            in_stack_fffffffffffffbb8);
      while (bVar7 = __gnu_cxx::operator!=
                               ((__normal_iterator<Annotation_*,_std::vector<Annotation,_std::allocator<Annotation>_>_>
                                 *)in_stack_fffffffffffffbc0,
                                (__normal_iterator<Annotation_*,_std::vector<Annotation,_std::allocator<Annotation>_>_>
                                 *)in_stack_fffffffffffffbb8), bVar7) {
        local_58 = __gnu_cxx::
                   __normal_iterator<Annotation_*,_std::vector<Annotation,_std::allocator<Annotation>_>_>
                   ::operator*(&local_48);
        local_58->hovered = false;
        __gnu_cxx::
        __normal_iterator<Annotation_*,_std::vector<Annotation,_std::allocator<Annotation>_>_>::
        operator++(&local_48);
      }
    }
    local_5c = (float)*(int *)(in_RDI + 0xd6a0) * 1.0;
    local_5c = local_5c * local_5c;
    local_68 = (element_type *)0x0;
    local_70 = (**(code **)(**(long **)(in_RDI + 8) + 0x20))();
    local_78._M_current =
         (shared_ptr<Pin> *)
         std::vector<std::shared_ptr<Pin>,_std::allocator<std::shared_ptr<Pin>_>_>::begin
                   ((vector<std::shared_ptr<Pin>,_std::allocator<std::shared_ptr<Pin>_>_> *)
                    in_stack_fffffffffffffbb8);
    local_80 = (shared_ptr<Pin> *)
               std::vector<std::shared_ptr<Pin>,_std::allocator<std::shared_ptr<Pin>_>_>::end
                         ((vector<std::shared_ptr<Pin>,_std::allocator<std::shared_ptr<Pin>_>_> *)
                          in_stack_fffffffffffffbb8);
    while (bVar7 = __gnu_cxx::operator!=
                             ((__normal_iterator<std::shared_ptr<Pin>_*,_std::vector<std::shared_ptr<Pin>,_std::allocator<std::shared_ptr<Pin>_>_>_>
                               *)in_stack_fffffffffffffbc0,
                              (__normal_iterator<std::shared_ptr<Pin>_*,_std::vector<std::shared_ptr<Pin>,_std::allocator<std::shared_ptr<Pin>_>_>_>
                               *)in_stack_fffffffffffffbb8), bVar7) {
      local_88 = &__gnu_cxx::
                  __normal_iterator<std::shared_ptr<Pin>_*,_std::vector<std::shared_ptr<Pin>,_std::allocator<std::shared_ptr<Pin>_>_>_>
                  ::operator*(&local_78)->super___shared_ptr<Pin,_(__gnu_cxx::_Lock_policy)2>;
      std::__shared_ptr_access<Pin,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
                ((__shared_ptr_access<Pin,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)0x121c48);
      std::shared_ptr<BoardElement>::shared_ptr<Component,void>
                ((shared_ptr<BoardElement> *)in_stack_fffffffffffffbc0,
                 (shared_ptr<Component> *)in_stack_fffffffffffffbb8);
      bVar7 = BoardElementIsVisible(in_stack_fffffffffffffbd8,in_stack_fffffffffffffbd0);
      std::shared_ptr<BoardElement>::~shared_ptr((shared_ptr<BoardElement> *)0x121c8f);
      if (bVar7) {
        peVar11 = std::__shared_ptr_access<Pin,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
                  operator->((__shared_ptr_access<Pin,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
                             0x121cac);
        local_a8 = (peVar11->position).x - local_28;
        peVar11 = std::__shared_ptr_access<Pin,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
                  operator->((__shared_ptr_access<Pin,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
                             0x121cd0);
        local_ac = (peVar11->position).y - id;
        local_b0 = local_a8 * local_a8 + local_ac * local_ac;
        if (local_b0 < local_5c) {
          local_68 = std::__shared_ptr<Pin,_(__gnu_cxx::_Lock_policy)2>::get(local_88);
          local_5c = local_b0;
        }
      }
      __gnu_cxx::
      __normal_iterator<std::shared_ptr<Pin>_*,_std::vector<std::shared_ptr<Pin>,_std::allocator<std::shared_ptr<Pin>_>_>_>
      ::operator++(&local_78);
    }
    if (local_68 == (element_type *)0x0) {
      local_b8 = (**(code **)(**(long **)(in_RDI + 8) + 0x18))();
      local_c0._M_current =
           (shared_ptr<Component> *)
           std::vector<std::shared_ptr<Component>,_std::allocator<std::shared_ptr<Component>_>_>::
           begin((vector<std::shared_ptr<Component>,_std::allocator<std::shared_ptr<Component>_>_> *
                 )in_stack_fffffffffffffbb8);
      local_c8 = (shared_ptr<Component> *)
                 std::
                 vector<std::shared_ptr<Component>,_std::allocator<std::shared_ptr<Component>_>_>::
                 end((vector<std::shared_ptr<Component>,_std::allocator<std::shared_ptr<Component>_>_>
                      *)in_stack_fffffffffffffbb8);
      while (bVar7 = __gnu_cxx::operator!=
                               ((__normal_iterator<std::shared_ptr<Component>_*,_std::vector<std::shared_ptr<Component>,_std::allocator<std::shared_ptr<Component>_>_>_>
                                 *)in_stack_fffffffffffffbc0,
                                (__normal_iterator<std::shared_ptr<Component>_*,_std::vector<std::shared_ptr<Component>,_std::allocator<std::shared_ptr<Component>_>_>_>
                                 *)in_stack_fffffffffffffbb8), bVar7) {
        local_d0 = __gnu_cxx::
                   __normal_iterator<std::shared_ptr<Component>_*,_std::vector<std::shared_ptr<Component>,_std::allocator<std::shared_ptr<Component>_>_>_>
                   ::operator*(&local_c0);
        local_d4 = 0;
        std::shared_ptr<BoardElement>::shared_ptr<Component,void>
                  ((shared_ptr<BoardElement> *)in_stack_fffffffffffffbc0,
                   (shared_ptr<Component> *)in_stack_fffffffffffffbb8);
        bVar7 = BoardElementIsVisible(in_stack_fffffffffffffbd8,in_stack_fffffffffffffbd0);
        in_stack_fffffffffffffd67 = bVar7 ^ 0xff;
        std::shared_ptr<BoardElement>::~shared_ptr((shared_ptr<BoardElement> *)0x121eda);
        if ((in_stack_fffffffffffffd67 & 1) == 0) {
          peVar12 = std::__shared_ptr_access<Component,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
                    operator->((__shared_ptr_access<Component,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                *)0x121f1f);
          local_108._M_elems[0] = (peVar12->outline)._M_elems[0];
          local_108._M_elems[1] = (peVar12->outline)._M_elems[1];
          local_108._M_elems[2] = (peVar12->outline)._M_elems[2];
          local_108._M_elems[3] = (peVar12->outline)._M_elems[3];
          local_110 = 0;
          sVar13 = std::array<ImVec2,_4UL>::size(&local_108);
          local_118 = sVar13 - 1;
          for (; uVar4 = local_110, sVar13 = std::array<ImVec2,_4UL>::size(&local_108),
              uVar4 < sVar13; local_110 = local_110 + 1) {
            pvVar14 = std::array<ImVec2,_4UL>::operator[]
                                ((array<ImVec2,_4UL> *)in_stack_fffffffffffffbc0,
                                 (size_type)in_stack_fffffffffffffbb8);
            bVar7 = id < pvVar14->y;
            pvVar14 = std::array<ImVec2,_4UL>::operator[]
                                ((array<ImVec2,_4UL> *)in_stack_fffffffffffffbc0,
                                 (size_type)in_stack_fffffffffffffbb8);
            if (bVar7 != id < pvVar14->y) {
              fVar5 = local_28;
              pvVar14 = std::array<ImVec2,_4UL>::operator[]
                                  ((array<ImVec2,_4UL> *)in_stack_fffffffffffffbc0,
                                   (size_type)in_stack_fffffffffffffbb8);
              fVar20 = pvVar14->x;
              pvVar14 = std::array<ImVec2,_4UL>::operator[]
                                  ((array<ImVec2,_4UL> *)in_stack_fffffffffffffbc0,
                                   (size_type)in_stack_fffffffffffffbb8);
              fVar21 = pvVar14->x;
              fVar6 = id;
              pvVar14 = std::array<ImVec2,_4UL>::operator[]
                                  ((array<ImVec2,_4UL> *)in_stack_fffffffffffffbc0,
                                   (size_type)in_stack_fffffffffffffbb8);
              fVar1 = pvVar14->y;
              pvVar14 = std::array<ImVec2,_4UL>::operator[]
                                  ((array<ImVec2,_4UL> *)in_stack_fffffffffffffbc0,
                                   (size_type)in_stack_fffffffffffffbb8);
              fVar2 = pvVar14->y;
              pvVar14 = std::array<ImVec2,_4UL>::operator[]
                                  ((array<ImVec2,_4UL> *)in_stack_fffffffffffffbc0,
                                   (size_type)in_stack_fffffffffffffbb8);
              fVar3 = pvVar14->y;
              pvVar14 = std::array<ImVec2,_4UL>::operator[]
                                  ((array<ImVec2,_4UL> *)in_stack_fffffffffffffbc0,
                                   (size_type)in_stack_fffffffffffffbb8);
              if (fVar5 < ((fVar20 - fVar21) * (fVar6 - fVar1)) / (fVar2 - fVar3) + pvVar14->x) {
                local_d4 = (uint)((local_d4 != 0 ^ 0xffU) & 1);
              }
            }
            local_118 = local_110;
          }
          if (local_d4 != 0) {
            peVar12 = std::__shared_ptr_access<Component,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                      ::operator->((__shared_ptr_access<Component,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                    *)0x1221a5);
            std::__cxx11::string::operator=
                      ((string *)&ContextMenu()::partn_abi_cxx11_,(string *)&peVar12->name);
            ImGui::SameLine(0.0,-1.0);
          }
        }
        __gnu_cxx::
        __normal_iterator<std::shared_ptr<Component>_*,_std::vector<std::shared_ptr<Component>,_std::allocator<std::shared_ptr<Component>_>_>_>
        ::operator++(&local_c0);
      }
    }
    else {
      std::__cxx11::string::operator=
                ((string *)&ContextMenu()::pin_abi_cxx11_,(string *)&local_68->name);
      peVar12 = std::__shared_ptr_access<Component,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
                operator->((__shared_ptr_access<Component,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                            *)0x121dcc);
      std::__cxx11::string::operator=
                ((string *)&ContextMenu()::partn_abi_cxx11_,(string *)&peVar12->name);
      std::__cxx11::string::operator=
                ((string *)&ContextMenu()::net_abi_cxx11_,(string *)&local_68->net->name);
    }
    this_00 = pAVar23;
    if ((-1 < *(int *)(in_RDI + 0xd218)) &&
       (((*(byte *)(in_RDI + 0xd212) & 1) != 0 || (-1 < *(int *)(in_RDI + 0xd218))))) {
      std::vector<Annotation,_std::allocator<Annotation>_>::operator[]
                ((vector<Annotation,_std::allocator<Annotation>_> *)(in_RDI + 0xd1f8),
                 (long)*(int *)(in_RDI + 0xd218));
      uVar24 = (undefined4)((ulong)in_stack_fffffffffffffbb8 >> 0x20);
      Annotation::Annotation
                ((Annotation *)CONCAT17(in_stack_fffffffffffffbf7,in_stack_fffffffffffffbf0),
                 in_stack_fffffffffffffbe8);
      if ((*(byte *)(in_RDI + 0xd212) & 1) == 0) {
        uVar15 = std::__cxx11::string::c_str();
        snprintf(ContextMenu::contextbuf,0x2800,"%s",uVar15);
        *(undefined1 *)(in_RDI + 0xd212) = 1;
        *(undefined1 *)(in_RDI + 0xd211) = 0;
      }
      local_2c9 = 'B';
      if (*(int *)(in_RDI + 0xd5dc) == 0) {
        local_2c9 = 'T';
      }
      this_00 = pAVar23;
      uVar15 = std::__cxx11::string::c_str();
      uVar16 = std::__cxx11::string::c_str();
      lVar17 = std::__cxx11::string::size();
      bVar7 = false;
      if (lVar17 != 0) {
        lVar17 = std::__cxx11::string::size();
        bVar7 = lVar17 != 0;
      }
      local_2f5 = '[';
      if (!bVar7) {
        local_2f5 = ' ';
      }
      uVar18 = std::__cxx11::string::c_str();
      lVar17 = std::__cxx11::string::size();
      bVar7 = false;
      if (lVar17 != 0) {
        lVar17 = std::__cxx11::string::size();
        bVar7 = lVar17 != 0;
      }
      uVar19 = 0x20;
      if (bVar7) {
        uVar19 = 0x5d;
      }
      ImGui::Text(fmt,pAVar23,"%c(%0.0f,%0.0f) %s, %s%c%s%c",(ulong)(uint)(int)local_2c9,uVar15,
                  uVar16,(ulong)(uint)(int)local_2f5,uVar18,CONCAT44(uVar24,uVar19));
      iVar10 = DPI(600);
      fVar20 = ImGui::GetTextLineHeight();
      ImVec2::ImVec2(local_1c0,(float)iVar10,fVar20 * 8.0);
      in_stack_fffffffffffffbb8 = ContextMenu::contextbuf;
      ImGui::InputTextMultiline
                ((char *)CONCAT17(in_stack_fffffffffffffbf7,in_stack_fffffffffffffbf0),
                 (char *)in_stack_fffffffffffffbe8,
                 CONCAT44(in_stack_fffffffffffffbe4,in_stack_fffffffffffffbe0),
                 (ImVec2 *)in_stack_fffffffffffffbd8,
                 (ImGuiInputTextFlags)((ulong)in_stack_fffffffffffffbd0 >> 0x20),
                 (ImGuiInputTextCallback)
                 CONCAT17(in_stack_fffffffffffffbcf,
                          CONCAT16(in_stack_fffffffffffffbce,
                                   CONCAT24(in_stack_fffffffffffffbcc,in_stack_fffffffffffffbc8))),
                 (void *)CONCAT44(in_stack_fffffffffffffc04,in_stack_fffffffffffffc00));
      local_1ea = 0;
      local_1eb = 0;
      ImVec2::ImVec2(&local_1c8,0.0,0.0);
      bVar7 = ImGui::Button((char *)in_stack_fffffffffffffbc0,(ImVec2 *)in_stack_fffffffffffffbb8);
      local_312 = true;
      if (!bVar7) {
        std::allocator<char>::allocator();
        local_1ea = 1;
        std::__cxx11::string::string<std::allocator<char>>
                  ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   CONCAT44(in_stack_fffffffffffffc04,in_stack_fffffffffffffc00),
                   in_stack_fffffffffffffbf8,
                   (allocator<char> *)CONCAT17(in_stack_fffffffffffffbf7,in_stack_fffffffffffffbf0))
        ;
        local_1eb = 1;
        local_312 = KeyBindings::isPressed
                              ((KeyBindings *)in_stack_fffffffffffffbe8,
                               (string *)
                               CONCAT44(in_stack_fffffffffffffbe4,in_stack_fffffffffffffbe0));
      }
      if ((local_1eb & 1) != 0) {
        std::__cxx11::string::~string(local_1e8);
      }
      if ((local_1ea & 1) != 0) {
        std::allocator<char>::~allocator(&local_1e9);
      }
      if (local_312 != false) {
        *(undefined1 *)(in_RDI + 0xd212) = 0;
        std::vector<Annotation,_std::allocator<Annotation>_>::operator[]
                  ((vector<Annotation,_std::allocator<Annotation>_> *)(in_RDI + 0xd1f8),
                   (long)*(int *)(in_RDI + 0xd218));
        Annotations::Update(in_stack_000023e0,in_stack_000023dc,in_stack_000023d0);
        Annotations::GenerateList
                  ((Annotations *)CONCAT17(in_stack_fffffffffffffd67,in_stack_fffffffffffffd60));
        *(undefined1 *)(in_RDI + 0xd6a6) = 1;
        ImGui::CloseCurrentPopup();
      }
      ImGui::SameLine(0.0,-1.0);
      ImVec2::ImVec2(&local_1f4,0.0,0.0);
      bVar7 = ImGui::Button((char *)in_stack_fffffffffffffbc0,(ImVec2 *)in_stack_fffffffffffffbb8);
      if (bVar7) {
        ImGui::CloseCurrentPopup();
        *(undefined1 *)(in_RDI + 0xd211) = 0;
      }
      ImGui::Separator();
      Annotation::~Annotation(in_stack_fffffffffffffbc0);
    }
    if ((*(int *)(in_RDI + 0xd218) < 0) && ((*(byte *)(in_RDI + 0xd211) & 1) == 0)) {
      local_33a = 'B';
      if (*(int *)(in_RDI + 0xd5dc) == 0) {
        local_33a = 'T';
      }
      uVar15 = std::__cxx11::string::c_str();
      uVar24 = (undefined4)((ulong)in_stack_fffffffffffffbb8 >> 0x20);
      uVar16 = std::__cxx11::string::c_str();
      bVar8 = std::__cxx11::string::empty();
      local_33c = 1;
      if ((bVar8 & 1) == 0) {
        local_33c = std::__cxx11::string::empty();
      }
      local_365 = ' ';
      if ((local_33c & 1) == 0) {
        local_365 = '[';
      }
      uVar18 = std::__cxx11::string::c_str();
      bVar8 = std::__cxx11::string::empty();
      local_367 = 1;
      if ((bVar8 & 1) == 0) {
        local_367 = std::__cxx11::string::empty();
      }
      local_375 = ' ';
      if ((local_367 & 1) == 0) {
        local_375 = ']';
      }
      in_stack_fffffffffffffbb8 = (char *)CONCAT44(uVar24,(int)local_375);
      ImGui::Text(fmt,"%c(%0.0f,%0.0f) %s %s%c%s%c",(ulong)(uint)(int)local_33a,uVar15,uVar16,
                  (ulong)(uint)(int)local_365,uVar18);
    }
    local_377 = 1;
    if (-1 < *(int *)(in_RDI + 0xd218)) {
      ImVec2::ImVec2(&local_1fc,0.0,0.0);
      bVar7 = ImGui::Button((char *)in_stack_fffffffffffffbc0,(ImVec2 *)in_stack_fffffffffffffbb8);
      local_377 = 1;
      if (!bVar7) {
        local_377 = *(byte *)(in_RDI + 0xd211);
      }
    }
    if ((local_377 & 1) == 0) {
      ImGui::SameLine(0.0,-1.0);
    }
    else {
      if ((*(byte *)(in_RDI + 0xd211) & 1) == 0) {
        ContextMenu::contextbufnew[0] = '\0';
        *(undefined1 *)(in_RDI + 0xd211) = 1;
        *(undefined4 *)(in_RDI + 0xd218) = 0xffffffff;
        *(undefined1 *)(in_RDI + 0xd212) = 0;
      }
      local_378 = 'B';
      if (*(int *)(in_RDI + 0xd5dc) == 0) {
        local_378 = 'T';
      }
      pAVar23 = this_00;
      uVar15 = std::__cxx11::string::c_str();
      uVar24 = (undefined4)((ulong)in_stack_fffffffffffffbb8 >> 0x20);
      uVar16 = std::__cxx11::string::c_str();
      bVar8 = std::__cxx11::string::empty();
      bVar26 = 1;
      if ((bVar8 & 1) == 0) {
        bVar26 = std::__cxx11::string::empty();
      }
      local_3a5 = ' ';
      if ((bVar26 & 1) == 0) {
        local_3a5 = '[';
      }
      uVar18 = std::__cxx11::string::c_str();
      bVar8 = std::__cxx11::string::empty();
      local_3a7 = 1;
      if ((bVar8 & 1) == 0) {
        local_3a7 = std::__cxx11::string::empty();
      }
      local_3b5 = ' ';
      if ((local_3a7 & 1) == 0) {
        local_3b5 = ']';
      }
      ImGui::Text(fmt,this_00,"Create new annotation for: %c(%0.0f,%0.0f) %s %s%c%s%c",
                  (ulong)(uint)(int)local_378,uVar15,uVar16,(ulong)(uint)(int)local_3a5,uVar18,
                  CONCAT44(uVar24,(int)local_3b5));
      ImGui::Spacing();
      iVar10 = DPI(600);
      fVar20 = ImGui::GetTextLineHeight();
      ImVec2::ImVec2(&local_204,(float)iVar10,fVar20 * 8.0);
      in_stack_fffffffffffffbb8 = ContextMenu::contextbufnew;
      ImGui::InputTextMultiline
                ((char *)CONCAT17(in_stack_fffffffffffffbf7,in_stack_fffffffffffffbf0),
                 (char *)in_stack_fffffffffffffbe8,
                 CONCAT44(in_stack_fffffffffffffbe4,in_stack_fffffffffffffbe0),
                 (ImVec2 *)in_stack_fffffffffffffbd8,
                 (ImGuiInputTextFlags)((ulong)in_stack_fffffffffffffbd0 >> 0x20),
                 (ImGuiInputTextCallback)
                 CONCAT17(in_stack_fffffffffffffbcf,
                          CONCAT16(in_stack_fffffffffffffbce,
                                   CONCAT24(in_stack_fffffffffffffbcc,in_stack_fffffffffffffbc8))),
                 (void *)CONCAT44(in_stack_fffffffffffffc04,in_stack_fffffffffffffc00));
      ImVec2::ImVec2(&local_20c,0.0,0.0);
      bVar7 = ImGui::Button((char *)in_stack_fffffffffffffbc0,(ImVec2 *)in_stack_fffffffffffffbb8);
      local_232 = 0;
      local_233 = 0;
      local_3b7 = true;
      this_00 = pAVar23;
      if (!bVar7) {
        std::allocator<char>::allocator();
        local_232 = 1;
        std::__cxx11::string::string<std::allocator<char>>
                  ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   CONCAT44(in_stack_fffffffffffffc04,in_stack_fffffffffffffc00),
                   in_stack_fffffffffffffbf8,
                   (allocator<char> *)CONCAT17(in_stack_fffffffffffffbf7,in_stack_fffffffffffffbf0))
        ;
        local_233 = 1;
        local_3b7 = KeyBindings::isPressed
                              ((KeyBindings *)in_stack_fffffffffffffbe8,
                               (string *)
                               CONCAT44(in_stack_fffffffffffffbe4,in_stack_fffffffffffffbe0));
        this_00 = pAVar23;
      }
      if ((local_233 & 1) != 0) {
        std::__cxx11::string::~string(local_230);
      }
      if ((local_232 & 1) != 0) {
        std::allocator<char>::~allocator(&local_231);
      }
      if (local_3b7 != false) {
        *(undefined1 *)(in_RDI + 0xd211) = 0;
        if ((*(byte *)(in_RDI + 0xd1b8) & 1) != 0) {
          fprintf(_stderr,"DATA:\'%s\'\n\n",ContextMenu::contextbufnew);
        }
        in_stack_fffffffffffffbf8 = (char *)(in_RDI + 0xd1c8);
        in_stack_fffffffffffffc04 = *(undefined4 *)(in_RDI + 0xd5dc);
        std::__cxx11::string::c_str();
        std::__cxx11::string::c_str();
        std::__cxx11::string::c_str();
        Annotations::Add(in_stack_00002420,in_stack_0000241c,in_stack_00002410,in_stack_00002408,
                         in_stack_00002400,in_stack_000023f8,in_stack_000023f0,in_stack_000023e8);
        Annotations::GenerateList
                  ((Annotations *)CONCAT17(in_stack_fffffffffffffd67,in_stack_fffffffffffffd60));
        *(undefined1 *)(in_RDI + 0xd6a6) = 1;
        ImGui::CloseCurrentPopup();
      }
    }
    uVar25 = false;
    if (-1 < *(int *)(in_RDI + 0xd218)) {
      ImVec2::ImVec2(&local_23c,0.0,0.0);
      uVar25 = ImGui::Button((char *)in_stack_fffffffffffffbc0,(ImVec2 *)in_stack_fffffffffffffbb8);
    }
    if ((bool)uVar25 != false) {
      in_stack_fffffffffffffbe8 = (Annotation *)(in_RDI + 0xd1c8);
      std::vector<Annotation,_std::allocator<Annotation>_>::operator[]
                ((vector<Annotation,_std::allocator<Annotation>_> *)(in_RDI + 0xd1f8),
                 (long)*(int *)(in_RDI + 0xd218));
      Annotations::Remove(this_00,(int)id);
      Annotations::GenerateList
                ((Annotations *)CONCAT17(in_stack_fffffffffffffd67,in_stack_fffffffffffffd60));
      *(undefined1 *)(in_RDI + 0xd6a6) = 1;
      ImGui::CloseCurrentPopup();
    }
    ImGui::SameLine(0.0,-1.0);
    ImVec2::ImVec2(&local_244,0.0,0.0);
    bVar7 = ImGui::Button((char *)in_stack_fffffffffffffbc0,(ImVec2 *)in_stack_fffffffffffffbb8);
    iVar10 = CONCAT13(1,(int3)in_stack_fffffffffffffbe4);
    if (!bVar7) {
      in_stack_fffffffffffffbd0 = (shared_ptr<BoardElement> *)(in_RDI + 0xc9f0);
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 CONCAT44(in_stack_fffffffffffffc04,in_stack_fffffffffffffc00),
                 in_stack_fffffffffffffbf8,
                 (allocator<char> *)CONCAT17(uVar25,in_stack_fffffffffffffbf0));
      bVar9 = KeyBindings::isPressed
                        ((KeyBindings *)in_stack_fffffffffffffbe8,
                         (string *)CONCAT44(iVar10,in_stack_fffffffffffffbe0));
      iVar10 = (uint)bVar9 << 0x18;
    }
    bVar8 = (byte)((uint)iVar10 >> 0x18);
    if (!bVar7) {
      std::__cxx11::string::~string(local_268);
      std::allocator<char>::~allocator(&local_269);
    }
    if ((bVar8 & 1) != 0) {
      *(undefined1 *)(in_RDI + 0xd211) = 0;
      *(undefined1 *)(in_RDI + 0xd212) = 0;
      ImGui::CloseCurrentPopup();
    }
    ImGui::EndPopup();
  }
  ImGui::PopStyleVar((int)((ulong)in_stack_fffffffffffffbd0 >> 0x20));
  return;
}

Assistant:

void BoardView::ContextMenu(void) {
	bool dummy                       = true;
	static char contextbuf[10240]    = "";
	static char contextbufnew[10240] = "";
	static std::string pin, partn, net;
	double tx, ty;

	ImVec2 pos = ScreenToCoord(m_showContextMenuPos.x, m_showContextMenuPos.y);

	/*
	 * So we don't have dozens of near-same-spot annotation points, we truncate
	 * back to integer levels, which still gives us 1-thou precision
	 */
	tx = trunc(pos.x);
	ty = trunc(pos.y);

	/*
	 * Originally the dialog was to follow the cursor but it proved to be an overkill
	 * to try adjust things to keep it within the bounds of the window so as to not
	 * lose the buttons.
	 *
	 * Now it's kept at a fixed point.
	 */
	ImGui::SetNextWindowPos(ImVec2(DPIF(50), DPIF(50)));
	ImGui::PushStyleVar(ImGuiStyleVar_WindowBorderSize, 1.0f);
	if (ImGui::BeginPopupModal("Annotations", &dummy, ImGuiWindowFlags_AlwaysAutoResize)) {

		if (m_showContextMenu) {
			contextbuf[0]      = 0;
			m_showContextMenu  = false;
			for (auto &ann : m_annotations.annotations) ann.hovered = false;
		}

		/*
		 * For the new annotation possibility, we need to detect our various
		 * attributes that we can bind to, such as pin, net, part
		 */
		{
			/*
			 * we're going to go through all the possible items we can annotate at this position and offer them
			 */

			float min_dist = m_pinDiameter * 1.0f;

			/*
			 * find the closest pin, starting at no more than
			 * 1 radius away
			 */
			min_dist *= min_dist; // all distance squared
			Pin *selection = nullptr;
			for (auto &pin : m_board->Pins()) {
				if (BoardElementIsVisible(pin->component)) {
					float dx   = pin->position.x - pos.x;
					float dy   = pin->position.y - pos.y;
					float dist = dx * dx + dy * dy;
					if (dist < min_dist) {
						selection = pin.get();
						min_dist  = dist;
					}
				}
			}

			/*
			 * If there was a pin selected, we can extract net/part off it
			 */

			if (selection != nullptr) {
				pin   = selection->name;
				partn = selection->component->name;
				net   = selection->net->name;
			} else {

				/*
				 * ELSE if we didn't get a pin selected, we can still
				 * check for a part.
				 *
				 * There is a problem where we can be on two parts
				 * but haven't decided what to do in such a situation
				 */

				for (auto &part : m_board->Components()) {
					int hit = 0;
					//					auto p_part = part.get();

					if (!BoardElementIsVisible(part)) continue;

					// Work out if the point is inside the hull
					{
						auto poly = part->outline;

						for (size_t i = 0, j = poly.size() - 1; i < poly.size(); j = i++) {
							if (((poly[i].y > pos.y) != (poly[j].y > pos.y)) &&
							    (pos.x < (poly[j].x - poly[i].x) * (pos.y - poly[i].y) / (poly[j].y - poly[i].y) + poly[i].x))
								hit = !hit;
						}
					} // hull test
					if (hit) {
						partn = part->name;

						ImGui::SameLine();
					}

				} // for each part
			}

			{

				/*
				 * For existing annotations
				 */
				if (m_annotation_clicked_id >= 0) {
					if (m_annotationedit_retain || (m_annotation_clicked_id >= 0)) {
						Annotation ann = m_annotations.annotations[m_annotation_clicked_id];
						if (!m_annotationedit_retain) {
							snprintf(contextbuf, sizeof(contextbuf), "%s", ann.note.c_str());
							m_annotationedit_retain = true;
							m_annotationnew_retain  = false;
						}

						ImGui::Text("%c(%0.0f,%0.0f) %s, %s%c%s%c",
						            m_current_side ? 'B' : 'T',
						            tx,
						            ty,
						            ann.net.c_str(),
						            ann.part.c_str(),
						            ann.part.size() && ann.pin.size() ? '[' : ' ',
						            ann.pin.c_str(),
						            ann.part.size() && ann.pin.size() ? ']' : ' ');
						ImGui::InputTextMultiline("##annotationedit",
						                          contextbuf,
						                          sizeof(contextbuf),
						                          ImVec2(DPI(600), ImGui::GetTextLineHeight() * 8),
						                          0,
						                          NULL,
						                          contextbuf);

						if (ImGui::Button("Update##1") || keybindings.isPressed("Validate")) {
							m_annotationedit_retain = false;
							m_annotations.Update(m_annotations.annotations[m_annotation_clicked_id].id, contextbuf);
							m_annotations.GenerateList();
							m_needsRedraw      = true;
							ImGui::CloseCurrentPopup();
						}
						ImGui::SameLine();
						if (ImGui::Button("Cancel##1")) {
							ImGui::CloseCurrentPopup();
							m_annotationnew_retain = false;
						}
						ImGui::Separator();
					}
				}

				/*
				 * For generating a new annotation
				 */
				if ((m_annotation_clicked_id < 0) && (m_annotationnew_retain == false)) {
					ImGui::Text("%c(%0.0f,%0.0f) %s %s%c%s%c",
					            m_current_side ? 'B' : 'T',
					            tx,
					            ty,
					            net.c_str(),
					            partn.c_str(),
					            partn.empty() || pin.empty() ? ' ' : '[',
					            pin.c_str(),
					            partn.empty() || pin.empty() ? ' ' : ']');
				}
				if ((m_annotation_clicked_id < 0) || ImGui::Button("Add New##1") || m_annotationnew_retain) {
					if (m_annotationnew_retain == false) {
						contextbufnew[0]        = 0;
						m_annotationnew_retain  = true;
						m_annotation_clicked_id = -1;
						m_annotationedit_retain = false;
					}

					ImGui::Text("Create new annotation for: %c(%0.0f,%0.0f) %s %s%c%s%c",
					            m_current_side ? 'B' : 'T',
					            tx,
					            ty,
					            net.c_str(),
					            partn.c_str(),
					            partn.empty() || pin.empty() ? ' ' : '[',
					            pin.c_str(),
					            partn.empty() || pin.empty() ? ' ' : ']');
					ImGui::Spacing();
					ImGui::InputTextMultiline("New##annotationnew",
					                          contextbufnew,
					                          sizeof(contextbufnew),
					                          ImVec2(DPI(600), ImGui::GetTextLineHeight() * 8),
					                          0,
					                          NULL,
					                          contextbufnew);

					if (ImGui::Button("Apply##1") || keybindings.isPressed("Validate")) {
						m_annotationnew_retain = false;
						if (debug) fprintf(stderr, "DATA:'%s'\n\n", contextbufnew);

						m_annotations.Add(m_current_side, tx, ty, net.c_str(), partn.c_str(), pin.c_str(), contextbufnew);
						m_annotations.GenerateList();
						m_needsRedraw = true;

						ImGui::CloseCurrentPopup();
					}
					/*
					ImGui::SameLine();
					if (ImGui::Button("Cancel")) {
					    ImGui::CloseCurrentPopup();
					    m_annotationnew_retain = false;
					}
					*/
				} else {
					ImGui::SameLine();
				}

				if ((m_annotation_clicked_id >= 0) && (ImGui::Button("Remove"))) {
					m_annotations.Remove(m_annotations.annotations[m_annotation_clicked_id].id);
					m_annotations.GenerateList();
					m_needsRedraw = true;
					ImGui::CloseCurrentPopup();
				}
			}

			// the position.
		}

		ImGui::SameLine();
		if (ImGui::Button("Cancel##2") || keybindings.isPressed("CloseDialog")) {
			m_annotationnew_retain  = false;
			m_annotationedit_retain = false;
			ImGui::CloseCurrentPopup();
		}
		ImGui::EndPopup();
	}
	ImGui::PopStyleVar();

	/** if the dialog was closed by using the (X) icon **/
	if (!dummy) {
		m_annotationnew_retain  = false;
		m_annotationedit_retain = false;
	}
}